

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O1

void init_trip(trip_t *record)

{
  record->route_id[0] = '\0';
  record->service_id[0] = '\0';
  record->id[0] = '\0';
  record->headsign[0] = '\0';
  record->short_name[0] = '\0';
  record->direction_id = 0;
  record->block_id[0] = '\0';
  record->shape_id[0] = '\0';
  record->wheelchair_accessible = WA_UNKNOWN;
  record->bikes_allowed = BA_UNKNOWN;
  return;
}

Assistant:

void init_trip(trip_t *record) {
    strcpy(record->route_id, "");
    strcpy(record->service_id, "");
    strcpy(record->id, "");
    strcpy(record->headsign, "");
    strcpy(record->short_name, "");
    record->direction_id = 0;
    strcpy(record->block_id, "");
    strcpy(record->shape_id, "");
    record->wheelchair_accessible = WA_UNKNOWN;
    record->bikes_allowed = BA_UNKNOWN;
}